

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

BaseFab<char> * __thiscall
amrex::BaseFab<char>::plus<(amrex::RunOn)1>
          (BaseFab<char> *this,BaseFab<char> *src,Box *srcbox,Box *destbox,int srccomp,int destcomp,
          int numcomp)

{
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  BaseFab<char> *in_RDI;
  undefined4 in_R8D;
  Dim3 offset;
  Dim3 slo;
  Dim3 dlo;
  Array4<const_char> *s;
  Array4<char> *d;
  undefined1 local_438 [24];
  anon_class_152_5_d58b1f45 *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbec;
  Box *in_stack_fffffffffffffbf0;
  undefined1 auStack_3f0 [64];
  undefined8 local_3b0;
  int local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  int local_39c;
  int iStack_398;
  int local_394;
  undefined8 local_390;
  int local_388;
  undefined8 local_37c;
  int local_374;
  undefined8 local_370;
  int local_368;
  undefined8 local_360;
  int local_358;
  Array4<const_char> local_350;
  Array4<const_char> *local_310;
  Array4<char> local_308;
  Array4<char> *local_2c8;
  undefined4 local_2bc;
  int *local_2b8;
  int *local_2b0;
  long local_2a8;
  long local_298;
  undefined8 local_288;
  int local_280;
  int *local_278;
  int local_270;
  int iStack_26c;
  int local_268;
  undefined4 local_264;
  int *local_260;
  undefined4 local_254;
  int *local_250;
  undefined4 local_244;
  int *local_240;
  undefined8 local_238;
  int local_230;
  int *local_228;
  int local_220;
  int iStack_21c;
  int local_218;
  undefined4 local_214;
  int *local_210;
  undefined4 local_204;
  int *local_200;
  undefined4 local_1f4;
  int *local_1f0;
  undefined4 *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  char *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  char *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_a8 = in_RDI->dptr;
  local_b0 = &in_RDI->domain;
  local_b4 = in_RDI->nvar;
  local_5c = 0;
  local_88 = (local_b0->smallend).vect[0];
  local_6c = 1;
  iStack_84 = (in_RDI->domain).smallend.vect[1];
  local_d0.x = (local_b0->smallend).vect[0];
  local_d0.y = (local_b0->smallend).vect[1];
  local_7c = 2;
  local_d0.z = (in_RDI->domain).smallend.vect[2];
  local_8 = &(in_RDI->domain).bigend;
  local_c = 0;
  local_38 = local_8->vect[0] + 1;
  local_18 = &(in_RDI->domain).bigend;
  local_1c = 1;
  iStack_34 = (in_RDI->domain).bigend.vect[1] + 1;
  local_28 = &(in_RDI->domain).bigend;
  local_2c = 2;
  local_f0.z = (in_RDI->domain).bigend.vect[2] + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_2bc = in_R8D;
  local_2b8 = in_RCX;
  local_2b0 = in_RDX;
  local_2a8 = in_RSI;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<char>::Array4(&local_308,local_a8,&local_c0,&local_e0,local_b4);
  local_298 = local_2a8;
  local_198 = *(char **)(local_2a8 + 0x10);
  local_1a0 = (undefined8 *)(local_2a8 + 0x18);
  local_1a4 = *(int *)(local_2a8 + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(local_2a8 + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(local_2a8 + 0x20);
  local_f8 = (int *)(local_2a8 + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = local_2a8 + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(local_2a8 + 0x28) + 1;
  local_118 = local_2a8 + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(local_2a8 + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_2c8 = &local_308;
  local_1d0._0_8_ = local_1e0._0_8_;
  local_1d0.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<const_char>::Array4(&local_350,local_198,&local_1b0,&local_1d0,local_1a4);
  local_228 = local_2b8;
  local_1f0 = local_2b8;
  local_1f4 = 0;
  local_220 = *local_2b8;
  local_200 = local_2b8;
  local_204 = 1;
  iStack_21c = local_2b8[1];
  local_370 = *(undefined8 *)local_2b8;
  local_210 = local_2b8;
  local_214 = 2;
  local_368 = local_2b8[2];
  local_278 = local_2b0;
  local_240 = local_2b0;
  local_244 = 0;
  local_270 = *local_2b0;
  local_250 = local_2b0;
  local_254 = 1;
  iStack_26c = local_2b0[1];
  local_390 = *(undefined8 *)local_2b0;
  local_260 = local_2b0;
  local_264 = 2;
  local_388 = local_2b0[2];
  local_39c = local_270 - local_220;
  iStack_398 = iStack_26c - iStack_21c;
  local_394 = local_388 - local_368;
  local_3a0 = 1;
  local_1e8 = &local_3a0;
  local_37c = local_390;
  local_374 = local_388;
  local_360 = local_370;
  local_358 = local_368;
  local_310 = &local_350;
  local_288 = local_390;
  local_280 = local_388;
  local_268 = local_388;
  local_238 = local_370;
  local_230 = local_368;
  local_218 = local_368;
  memcpy(local_438,local_2c8,0x3c);
  memcpy(auStack_3f0,local_310,0x3c);
  local_3b0 = CONCAT44(iStack_398,local_39c);
  local_3a8 = local_394;
  local_3a4 = local_2bc;
  LoopConcurrentOnCpu<amrex::BaseFab<char>::plus<(amrex::RunOn)1>(amrex::BaseFab<char>const&,amrex::Box_const&,amrex::Box_const&,int,int,int)::_lambda(int,int,int,int)_1_>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,in_stack_fffffffffffffbe0);
  return in_RDI;
}

Assistant:

BaseFab<T>&
BaseFab<T>::plus (const BaseFab<T>& src, const Box& srcbox, const Box& destbox,
                  int srccomp, int destcomp, int numcomp) noexcept
{
    BL_ASSERT(destbox.ok());
    BL_ASSERT(src.box().contains(srcbox));
    BL_ASSERT(box().contains(destbox));
    BL_ASSERT(destbox.sameSize(srcbox));
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= src.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= nComp());

    Array4<T> const& d = this->array();
    Array4<T const> const& s = src.const_array();
    const auto dlo = amrex::lbound(destbox);
    const auto slo = amrex::lbound(srcbox);
    const Dim3 offset{slo.x-dlo.x,slo.y-dlo.y,slo.z-dlo.z};
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(run_on, destbox, numcomp, i, j, k, n,
    {
        d(i,j,k,n+destcomp) += s(i+offset.x,j+offset.y,k+offset.z,n+srccomp);
    });

    return *this;
}